

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall
HDWallet_GetMnemonicWordlistErrorTest_Test::TestBody
          (HDWallet_GetMnemonicWordlistErrorTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  CfdException *e;
  AssertionResult gtest_ar_;
  Message local_a0 [2];
  CfdException *anon_var_0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  byte local_69;
  char *pcStack_68;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actual_wordlist;
  allocator local_31;
  undefined1 local_30 [8];
  string language;
  HDWallet_GetMnemonicWordlistErrorTest_Test *this_local;
  
  language.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"zz",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff98);
  if (bVar1) {
    local_69 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GetMnemonicWordlist(&local_88,(string *)local_30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_msg,&local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
    }
    if ((local_69 & 1) != 0) goto LAB_0027a57d;
    pcStack_68 = 
    "Expected: actual_wordlist = HDWallet::GetMnemonicWordlist(language) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_a0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
             ,0x2c,pcStack_68);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_a0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
  testing::Message::~Message(local_a0);
LAB_0027a57d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_msg);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(HDWallet, GetMnemonicWordlistErrorTest) {
  try {
    std::string language = "zz";
    std::vector<std::string> actual_wordlist;
    EXPECT_THROW(actual_wordlist = HDWallet::GetMnemonicWordlist(language), CfdException);
  } catch (CfdException &e) {
    EXPECT_STREQ(e.what(), "Not support language passed.");
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }
}